

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void * Memory::StandAloneFreeListPolicy::Allocate(void *policy,size_t size)

{
  undefined4 uVar1;
  code *pcVar2;
  bool bVar3;
  int *piVar4;
  long *plVar5;
  undefined8 *in_FS_OFFSET;
  uint oldFreeList;
  FreeObjectListEntry *entry;
  uint *freeObjectList;
  void *object;
  size_t index;
  StandAloneFreeListPolicy *_this;
  size_t size_local;
  void *policy_local;
  
  if (policy == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                       ,0x36f,"(policy)","policy");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  freeObjectList = (uint *)0x0;
  piVar4 = (int *)(*(long *)((long)policy + 0x10) + ((size >> 4) - 1) * 4);
  if (*piVar4 != 0) {
    plVar5 = (long *)(*(long *)((long)policy + 0x18) + (ulong)(*piVar4 - 1) * 0x10);
    uVar1 = *(undefined4 *)((long)policy + 8);
    *(int *)((long)policy + 8) = *piVar4;
    *piVar4 = (int)plVar5[1];
    freeObjectList = (uint *)*plVar5;
    if (freeObjectList == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0x37e,"(object != 0)","object != NULL");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    *(undefined4 *)(plVar5 + 1) = uVar1;
    *plVar5 = 0;
  }
  return freeObjectList;
}

Assistant:

void * StandAloneFreeListPolicy::Allocate(void * policy, size_t size)
{
    Assert(policy);

    StandAloneFreeListPolicy * _this = reinterpret_cast<StandAloneFreeListPolicy *>(policy);
    size_t index = (size >> ArenaAllocator::ObjectAlignmentBitShift) - 1;
    void * object = NULL;

    uint * freeObjectList = &_this->freeObjectLists[index];
    if (0 != *freeObjectList)
    {
        FreeObjectListEntry * entry = &_this->entries[*freeObjectList - 1];
        uint oldFreeList = _this->freeList;

        _this->freeList = *freeObjectList;
        *freeObjectList = entry->next;
        object = entry->object;
        Assert(object != NULL);
        entry->next = oldFreeList;
        entry->object = NULL;
    }

    return object;
}